

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_send_stream(quicly_stream_t *stream,quicly_send_context_t *s)

{
  quicly_ranges_t *ranges;
  uint64_t *puVar1;
  ulong start;
  uint64_t uVar2;
  uint8_t *puVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  quicly_sent_t **ppqVar8;
  quicly_sent_t **ppqVar9;
  ulong uVar10;
  quicly_sent_t *pqVar11;
  size_t min_space;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  quicly_sent_t **__dest;
  quicly_sent_t *pqVar15;
  size_t __n;
  uint64_t uVar16;
  int wrote_all;
  size_t len;
  quicly_sent_t *sent;
  uint8_t header [18];
  int local_5c;
  quicly_sent_t **local_58;
  quicly_sent_t *local_50;
  byte local_48;
  byte bStack_47;
  undefined6 auStack_46 [2];
  
  start = ((stream->sendstate).pending.ranges)->start;
  __dest = (quicly_sent_t **)stream->stream_id;
  bVar5 = (byte)(start >> 8);
  if ((long)__dest < 0) {
    min_space = 4;
    if ((0x3f < start) && (min_space = 5, 0x3fff < start)) {
      min_space = (ulong)(0x3fffffff < start) * 4 + 7;
    }
    iVar7 = allocate_ack_eliciting_frame(stream->conn,s,min_space,&local_50,on_ack_stream);
    if (iVar7 != 0) {
      return iVar7;
    }
    puVar3 = s->dst;
    s->dst = puVar3 + 1;
    *puVar3 = '\x06';
    pbVar13 = s->dst;
    if (0x3f < start) {
      if (start < 0x4000) {
        *pbVar13 = bVar5 | 0x40;
        pbVar13 = pbVar13 + 1;
      }
      else {
        quicly_send_stream_cold_3();
        pbVar13 = (byte *)CONCAT62(auStack_46[0],CONCAT11(bStack_47,local_48));
      }
    }
    *pbVar13 = (byte)start;
    s->dst = pbVar13 + 1;
    ppqVar9 = (quicly_sent_t **)(s->dst_end + -(long)(pbVar13 + 1));
    __dest = (quicly_sent_t **)0x0;
  }
  else {
    pqVar11 = (quicly_sent_t *)&bStack_47;
    if ((quicly_sent_t **)0x3f < __dest) {
      if (__dest < (quicly_sent_t **)0x4000) {
        bStack_47 = (byte)((ulong)__dest >> 8) | 0x40;
        pqVar11 = (quicly_sent_t *)auStack_46;
      }
      else {
        quicly_send_stream_cold_1();
        pqVar11 = local_50;
      }
    }
    pqVar15 = (quicly_sent_t *)((long)&pqVar11->acked + 1);
    *(char *)&pqVar11->acked = (char)__dest;
    if (start == 0) {
      local_48 = 8;
    }
    else {
      local_48 = 0xc;
      if (0x3f < start) {
        if (start < 0x4000) {
          *(byte *)((long)&pqVar11->acked + 1) = bVar5 | 0x40;
          pqVar15 = (quicly_sent_t *)((long)&pqVar11->acked + 2);
        }
        else {
          __dest = &local_50;
          quicly_send_stream_cold_2();
          pqVar15 = local_50;
        }
      }
      *(byte *)&pqVar15->acked = (byte)start;
      pqVar15 = (quicly_sent_t *)((long)&pqVar15->acked + 1);
    }
    if (((stream->sendstate).final_size == 0xffffffffffffffff) ||
       (start != (stream->sendstate).final_size)) {
      __n = (long)pqVar15 - (long)&local_48;
      ppqVar9 = &local_50;
      uVar6 = allocate_ack_eliciting_frame(stream->conn,s,__n + 1,ppqVar9,on_ack_stream);
      if (uVar6 != 0) goto LAB_00128ba1;
      __dest = (quicly_sent_t **)s->dst;
      memcpy(__dest,&local_48,__n);
      puVar3 = s->dst;
      s->dst = puVar3 + __n;
      uVar10 = (stream->_send_aux).max_stream_data;
      ppqVar9 = (quicly_sent_t **)(uVar10 - start);
      if ((long)(s->dst_end + -(long)(puVar3 + __n)) + start <= uVar10) {
        ppqVar9 = (quicly_sent_t **)(s->dst_end + -(long)(puVar3 + __n));
      }
      ppqVar8 = (quicly_sent_t **)(stream->sendstate).size_inflight;
      iVar7 = 0;
      uVar10 = (long)((long)ppqVar9 + start) - (long)ppqVar8;
      if ((ppqVar8 < (quicly_sent_t **)((long)ppqVar9 + start)) &&
         (uVar16 = (stream->conn->egress).max_data.permitted,
         uVar2 = (stream->conn->egress).max_data.sent,
         ppqVar8 = (quicly_sent_t **)((long)ppqVar8 + (uVar16 - (uVar2 + start))),
         uVar16 - uVar2 < uVar10)) {
        ppqVar9 = ppqVar8;
      }
    }
    else {
      __dest = (quicly_sent_t **)&local_48;
      local_48 = local_48 | 1;
      ppqVar9 = &local_50;
      uVar6 = allocate_ack_eliciting_frame
                        (stream->conn,s,(long)pqVar15 - (long)__dest,ppqVar9,on_ack_stream);
      if (uVar6 == 0) {
        if ((long)pqVar15 - (long)__dest != (long)s->dst_end - (long)s->dst) {
          local_48 = local_48 | 2;
          *(undefined1 *)&pqVar15->acked = 0;
          pqVar15 = (quicly_sent_t *)((long)&pqVar15->acked + 1);
        }
        ppqVar8 = (quicly_sent_t **)memcpy(s->dst,__dest,(long)pqVar15 - (long)__dest);
        s->dst = s->dst + ((long)pqVar15 - (long)__dest);
        local_5c = 1;
        iVar7 = 2;
      }
      else {
LAB_00128ba1:
        ppqVar8 = (quicly_sent_t **)(ulong)uVar6;
        iVar7 = 1;
      }
    }
    if (iVar7 == 2) {
      lVar14 = 1;
      uVar16 = start;
      goto LAB_00128d94;
    }
    if (iVar7 != 0) {
      return (int)ppqVar8;
    }
  }
  uVar10 = ((stream->sendstate).pending.ranges)->end;
  ppqVar8 = (quicly_sent_t **)(uVar10 - start);
  if (((stream->sendstate).final_size != 0xffffffffffffffff) &&
     ((stream->sendstate).final_size < uVar10)) {
    if (ppqVar8 < (quicly_sent_t **)0x2) {
      __assert_fail("range_capacity > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xda6,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    ppqVar8 = (quicly_sent_t **)((long)ppqVar8 + -1);
  }
  if (ppqVar9 < ppqVar8) {
    ppqVar8 = ppqVar9;
  }
  if (ppqVar8 == (quicly_sent_t **)0x0) {
    __assert_fail("capacity != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdae,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  local_58 = ppqVar8;
  (*stream->callbacks->on_send_emit)
            (stream,start - ((stream->sendstate).acked.ranges)->end,s->dst,(size_t *)&local_58,
             &local_5c);
  if (QUICLY_STATE_CONNECTED < (stream->conn->super).state) {
    return 0xff06;
  }
  if ((stream->_send_aux).reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
    return 0;
  }
  if (ppqVar8 < local_58) {
    __assert_fail("len <= capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdb8,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (local_58 == (quicly_sent_t **)0x0) {
    __assert_fail("len != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0xdb9,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
  }
  if (__dest == (quicly_sent_t **)0x0) {
LAB_00128cd9:
    lVar14 = 1;
    if (((quicly_sent_t **)0x3f < local_58) && (lVar14 = 2, (quicly_sent_t **)0x3fff < local_58)) {
      lVar14 = (ulong)((quicly_sent_t **)0x3fffffff < local_58) * 4 + 4;
    }
    puVar3 = s->dst;
    uVar10 = (long)s->dst_end - (long)puVar3;
    if (uVar10 < (ulong)((long)local_58 + lVar14)) {
      local_58 = (quicly_sent_t **)(uVar10 - lVar14);
      local_5c = 0;
    }
    memmove(puVar3 + lVar14,puVar3,(size_t)local_58);
    ppqVar9 = local_58;
    pbVar13 = s->dst;
    if ((quicly_sent_t **)0x3f < local_58) {
      if (local_58 < (quicly_sent_t **)0x4000) {
        *pbVar13 = (byte)((ulong)local_58 >> 8) | 0x40;
        pbVar13 = pbVar13 + 1;
      }
      else {
        quicly_send_stream_cold_4();
        pbVar13 = (byte *)CONCAT62(auStack_46[0],CONCAT11(bStack_47,local_48));
      }
    }
    *pbVar13 = (byte)ppqVar9;
    s->dst = pbVar13 + 1;
  }
  else if (local_58 < s->dst_end + -(long)s->dst) {
    *(byte *)__dest = *(byte *)__dest | 2;
    goto LAB_00128cd9;
  }
  s->dst = s->dst + (long)local_58;
  uVar16 = (long)local_58 + start;
  if (((stream->sendstate).final_size == 0xffffffffffffffff) ||
     (uVar16 != (stream->sendstate).final_size)) {
    lVar14 = 0;
  }
  else {
    if (__dest == (quicly_sent_t **)0x0) {
      __assert_fail("frame_type_at != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xdcc,"int quicly_send_stream(quicly_stream_t *, quicly_send_context_t *)");
    }
    *(byte *)__dest = *(byte *)__dest | 1;
    lVar14 = 1;
  }
LAB_00128d94:
  lVar4 = stream->stream_id;
  puVar1 = &(stream->conn->super).stats.num_frames_sent.crypto + (ulong)(-1 < lVar4) * 2;
  *puVar1 = *puVar1 + 1;
  ranges = &(stream->sendstate).pending;
  puVar1 = &(stream->sendstate).size_inflight;
  lVar12 = uVar16 - *puVar1;
  if (*puVar1 <= uVar16 && lVar12 != 0) {
    if (-1 < lVar4) {
      puVar1 = &(stream->conn->egress).max_data.sent;
      *puVar1 = *puVar1 + lVar12;
    }
    (stream->sendstate).size_inflight = uVar16;
  }
  iVar7 = quicly_ranges_subtract(ranges,start,uVar16 + lVar14);
  if (iVar7 == 0) {
    if ((local_5c != 0) &&
       (iVar7 = quicly_ranges_subtract(ranges,(stream->sendstate).size_inflight,0xffffffffffffffff),
       iVar7 != 0)) {
      return iVar7;
    }
    (local_50->data).packet.packet_number = stream->stream_id;
    (local_50->data).ack.range.end = start;
    (local_50->data).stream.args.end = uVar16 + lVar14;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int quicly_send_stream(quicly_stream_t *stream, quicly_send_context_t *s)
{
    uint64_t off = stream->sendstate.pending.ranges[0].start, end_off;
    quicly_sent_t *sent;
    uint8_t *frame_type_at;
    size_t capacity, len;
    int ret, wrote_all, is_fin;

    /* write frame type, stream_id and offset, calculate capacity */
    if (stream->stream_id < 0) {
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s,
                                                1 + quicly_encodev_capacity(off) + 2 /* type + len + offset + 1-byte payload */,
                                                &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = NULL;
        *s->dst++ = QUICLY_FRAME_TYPE_CRYPTO;
        s->dst = quicly_encodev(s->dst, off);
        capacity = s->dst_end - s->dst;
    } else {
        uint8_t header[18], *hp = header + 1;
        hp = quicly_encodev(hp, stream->stream_id);
        if (off != 0) {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE | QUICLY_FRAME_TYPE_STREAM_BIT_OFF;
            hp = quicly_encodev(hp, off);
        } else {
            header[0] = QUICLY_FRAME_TYPE_STREAM_BASE;
        }
        if (!quicly_sendstate_is_open(&stream->sendstate) && off == stream->sendstate.final_size) {
            /* special case for emitting FIN only */
            header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
            if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header, &sent, on_ack_stream)) != 0)
                return ret;
            if (hp - header != s->dst_end - s->dst) {
                header[0] |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
                *hp++ = 0; /* empty length */
            }
            memcpy(s->dst, header, hp - header);
            s->dst += hp - header;
            end_off = off;
            wrote_all = 1;
            is_fin = 1;
            goto UpdateState;
        }
        if ((ret = allocate_ack_eliciting_frame(stream->conn, s, hp - header + 1, &sent, on_ack_stream)) != 0)
            return ret;
        frame_type_at = s->dst;
        memcpy(s->dst, header, hp - header);
        s->dst += hp - header;
        capacity = s->dst_end - s->dst;
        /* cap by max_stream_data */
        if (off + capacity > stream->_send_aux.max_stream_data)
            capacity = stream->_send_aux.max_stream_data - off;
        /* cap by max_data */
        if (off + capacity > stream->sendstate.size_inflight) {
            uint64_t new_bytes = off + capacity - stream->sendstate.size_inflight;
            if (new_bytes > stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent) {
                size_t max_stream_data =
                    stream->sendstate.size_inflight + stream->conn->egress.max_data.permitted - stream->conn->egress.max_data.sent;
                capacity = max_stream_data - off;
            }
        }
    }
    { /* cap the capacity to the current range */
        uint64_t range_capacity = stream->sendstate.pending.ranges[0].end - off;
        if (!quicly_sendstate_is_open(&stream->sendstate) && off + range_capacity > stream->sendstate.final_size) {
            assert(range_capacity > 1); /* see the special case above */
            range_capacity -= 1;
        }
        if (capacity > range_capacity)
            capacity = range_capacity;
    }

    /* write payload */
    assert(capacity != 0);
    len = capacity;
    size_t emit_off = (size_t)(off - stream->sendstate.acked.ranges[0].end);
    QUICLY_PROBE(STREAM_ON_SEND_EMIT, stream->conn, stream->conn->stash.now, stream, emit_off, len);
    stream->callbacks->on_send_emit(stream, emit_off, s->dst, &len, &wrote_all);
    if (stream->conn->super.state >= QUICLY_STATE_CLOSING) {
        return QUICLY_ERROR_IS_CLOSING;
    } else if (stream->_send_aux.reset_stream.sender_state != QUICLY_SENDER_STATE_NONE) {
        return 0;
    }
    assert(len <= capacity);
    assert(len != 0);

    /* update s->dst, insert length if necessary */
    if (frame_type_at == NULL || len < s->dst_end - s->dst) {
        if (frame_type_at != NULL)
            *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_LEN;
        size_t len_of_len = quicly_encodev_capacity(len);
        if (len_of_len + len > s->dst_end - s->dst) {
            len = s->dst_end - s->dst - len_of_len;
            wrote_all = 0;
        }
        memmove(s->dst + len_of_len, s->dst, len);
        s->dst = quicly_encodev(s->dst, len);
    }
    s->dst += len;
    end_off = off + len;

    /* determine if the frame incorporates FIN */
    if (!quicly_sendstate_is_open(&stream->sendstate) && end_off == stream->sendstate.final_size) {
        assert(frame_type_at != NULL);
        is_fin = 1;
        *frame_type_at |= QUICLY_FRAME_TYPE_STREAM_BIT_FIN;
    } else {
        is_fin = 0;
    }

UpdateState:
    if (stream->stream_id < 0) {
        ++stream->conn->super.stats.num_frames_sent.crypto;
    } else {
        ++stream->conn->super.stats.num_frames_sent.stream;
    }
    QUICLY_PROBE(STREAM_SEND, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    QUICLY_PROBE(QUICTRACE_SEND_STREAM, stream->conn, stream->conn->stash.now, stream, off, end_off - off, is_fin);
    /* update sendstate (and also MAX_DATA counter) */
    if (stream->sendstate.size_inflight < end_off) {
        if (stream->stream_id >= 0)
            stream->conn->egress.max_data.sent += end_off - stream->sendstate.size_inflight;
        stream->sendstate.size_inflight = end_off;
    }
    if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, off, end_off + is_fin)) != 0)
        return ret;
    if (wrote_all) {
        if ((ret = quicly_ranges_subtract(&stream->sendstate.pending, stream->sendstate.size_inflight, UINT64_MAX)) != 0)
            return ret;
    }

    /* setup sentmap */
    sent->data.stream.stream_id = stream->stream_id;
    sent->data.stream.args.start = off;
    sent->data.stream.args.end = end_off + is_fin;

    return 0;
}